

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
::RU_matrix(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
            *this,RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
                  *matrixToCopy,Column_settings *colSettings)

{
  Column_container *this_00;
  pointer pIVar1;
  Column_settings *pCVar2;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
  *cont;
  pointer pIVar3;
  
  RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
  ::RU_pairing(&this->super_RU_pairing_option,&matrixToCopy->super_RU_pairing_option);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&(this->super_RU_representative_cycles_option).representativeCycles_,
           &(matrixToCopy->super_RU_representative_cycles_option).representativeCycles_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&(this->super_RU_representative_cycles_option).birthToCycle_,
             &(matrixToCopy->super_RU_representative_cycles_option).birthToCycle_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&this->reducedMatrixR_,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&matrixToCopy->reducedMatrixR_);
  (this->reducedMatrixR_).super_Matrix_dimension_option.maxDim_ =
       (matrixToCopy->reducedMatrixR_).super_Matrix_dimension_option.maxDim_;
  this_00 = &(this->reducedMatrixR_).matrix_;
  (this->reducedMatrixR_).matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->reducedMatrixR_).matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->reducedMatrixR_).matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->reducedMatrixR_).nextInsertIndex_ = (matrixToCopy->reducedMatrixR_).nextInsertIndex_;
  pCVar2 = colSettings;
  if (colSettings == (Column_settings *)0x0) {
    pCVar2 = (matrixToCopy->reducedMatrixR_).colSettings_;
  }
  (this->reducedMatrixR_).colSettings_ = pCVar2;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
  ::reserve(this_00,((long)(matrixToCopy->reducedMatrixR_).matrix_.
                           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(matrixToCopy->reducedMatrixR_).matrix_.
                           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
  pIVar3 = (matrixToCopy->reducedMatrixR_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (matrixToCopy->reducedMatrixR_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar3 != pIVar1) {
    do {
      std::
      vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>>>
      ::
      emplace_back<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>const&,Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>::Column_zp_settings*&>
                ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>>>
                  *)this_00,pIVar3,&(this->reducedMatrixR_).colSettings_);
      pIVar3 = pIVar3 + 1;
    } while (pIVar3 != pIVar1);
  }
  (this->mirrorMatrixU_).matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mirrorMatrixU_).matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mirrorMatrixU_).matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mirrorMatrixU_).nextInsertIndex_ = (matrixToCopy->mirrorMatrixU_).nextInsertIndex_;
  pCVar2 = colSettings;
  if (colSettings == (Column_settings *)0x0) {
    pCVar2 = (matrixToCopy->mirrorMatrixU_).colSettings_;
  }
  (this->mirrorMatrixU_).colSettings_ = pCVar2;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
  ::reserve(&(this->mirrorMatrixU_).matrix_,
            ((long)(matrixToCopy->mirrorMatrixU_).matrix_.
                   super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(matrixToCopy->mirrorMatrixU_).matrix_.
                   super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
  pIVar3 = (matrixToCopy->mirrorMatrixU_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (matrixToCopy->mirrorMatrixU_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar3 != pIVar1) {
    do {
      std::
      vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>>>
      ::
      emplace_back<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>const&,Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>::Column_zp_settings*&>
                ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>>>
                  *)&this->mirrorMatrixU_,pIVar3,&(this->mirrorMatrixU_).colSettings_);
      pIVar3 = pIVar3 + 1;
    } while (pIVar3 != pIVar1);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->pivotToColumnIndex_,&matrixToCopy->pivotToColumnIndex_);
  this->nextEventIndex_ = matrixToCopy->nextEventIndex_;
  if (colSettings == (Column_settings *)0x0) {
    colSettings = (Column_settings *)matrixToCopy->operators_;
  }
  this->operators_ = &colSettings->operators;
  return;
}

Assistant:

inline RU_matrix<Master_matrix>::RU_matrix(const RU_matrix& matrixToCopy, Column_settings* colSettings)
    : Pair_opt(static_cast<const Pair_opt&>(matrixToCopy)),
      Swap_opt(static_cast<const Swap_opt&>(matrixToCopy)),
      Rep_opt(static_cast<const Rep_opt&>(matrixToCopy)),
      reducedMatrixR_(matrixToCopy.reducedMatrixR_, colSettings),
      mirrorMatrixU_(matrixToCopy.mirrorMatrixU_, colSettings),
      pivotToColumnIndex_(matrixToCopy.pivotToColumnIndex_),
      nextEventIndex_(matrixToCopy.nextEventIndex_),
      operators_(colSettings == nullptr ? matrixToCopy.operators_ : nullptr)
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }
}